

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O0

err_t cmdStampSelfVal(void)

{
  err_t eVar1;
  bool_t bVar2;
  size_t *count_00;
  blob_t buf1;
  void *buf;
  size_t *count_01;
  bool_t in_stack_0000000c;
  size_t count_1;
  char *name;
  octet *stamp1;
  octet *stamp;
  void *stack;
  size_t count;
  err_t code;
  char *ext;
  size_t in_stack_ffffffffffffffa8;
  size_t *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *src;
  long local_20;
  err_t local_14;
  err_t local_4;
  
  local_4 = cmdSysModulePath(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_4 == 0) {
    count_00 = (size_t *)(local_20 + 0x14);
    strLen((char *)0x10cb3e);
    buf1 = blobCreate(in_stack_ffffffffffffffa8);
    local_4 = 0x6e;
    if (buf1 != (blob_t)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      buf = (void *)((long)buf1 + 10);
      count_01 = (size_t *)((long)buf1 + 0x14);
      local_4 = cmdSysModulePath(in_stack_ffffffffffffffb8,count_00);
      if (local_4 == 0) {
        local_14 = cmdFileStamp((octet *)name,(char *)count_1,in_stack_0000000c);
        if (local_14 == 0xffffffff) {
          src = (char *)0xa;
          strLen((char *)0x10cc0f);
          strCopy((char *)count_01,src);
          eVar1 = cmdFileReadAll(buf,count_01,src);
          if (eVar1 != 0) {
            blobClose((blob_t)0x10cc49);
            return eVar1;
          }
          bVar2 = memEq(buf1,buf,10);
          local_14 = 0;
          if (bVar2 == 0) {
            local_14 = 0xd2;
          }
        }
        blobClose((blob_t)0x10cc80);
        local_4 = local_14;
      }
      else {
        blobClose((blob_t)0x10cbc3);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdStampSelfVal()
{
	const char* ext = ".stamp";
	err_t code;
	size_t count;
	void* stack;
	octet* stamp;
	octet* stamp1;
	char* name;
	// определить длину имени исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, 10 + 10 + count + strLen(ext));
	ERR_CALL_CHECK(code);
	stamp = (octet*)stack;
	stamp1 = stamp + 10;
	name = (char*)(stamp1 + 10);
	// определить имя исполняемого модуля
	code = cmdSysModulePath(name, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить присоединенный штамп
	code = cmdFileStamp(stamp, name, TRUE);
	// в файле нет штампа?
	if (code == ERR_MAX)
	{
		size_t count = 10;
		// прочитать отсоединенный штамп
		strCopy(name + strLen(name), ext);
		code = cmdFileReadAll(stamp1, &count, name);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить отсоединенный штамп
		if (!memEq(stamp, stamp1, 10))
			code = ERR_FILE_STAMP;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}